

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_2.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double c;
  char local_11;
  double local_10;
  
  local_10 = 0.0;
  std::istream::_M_extract<double>((double *)&std::cin);
  dVar2 = ctok(local_10);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  local_11 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return 0;
}

Assistant:

int main()
{
	double c = 0;// declare input variable
	std::cin >> c;// retrieve temperature to input variable
	double k = ctok(c);// convert temperature
	std::cout << k << '\n';// print out temperature
	return 0;
}